

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_string_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::InlinedStringField::SetAllocatedNoArena
          (InlinedStringField *this,string *param_1,string *value)

{
  if (value != (string *)0x0) {
    std::__cxx11::string::operator=((string *)this,(string *)value);
    std::__cxx11::string::~string((string *)value);
    operator_delete(value,0x20);
    return;
  }
  (this->field_0).str_._M_string_length = 0;
  **(undefined1 **)&this->field_0 = 0;
  return;
}

Assistant:

inline void InlinedStringField::SetAllocatedNoArena(
    const std::string* /*default_value*/, std::string* value) {
  if (value == nullptr) {
    // Currently, inlined string field can't have non empty default.
    get_mutable()->clear();
  } else {
    get_mutable()->assign(std::move(*value));
    delete value;
  }
}